

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall date_parse_result::def_time(date_parse_result *this,int m,int h,int s,int ms)

{
  date_parse_result *in_RDI;
  int in_stack_ffffffffffffffdc;
  
  if ((in_RDI->ampm == 1) && (in_RDI->hh == 0xc)) {
    in_RDI->hh = 0;
  }
  else if ((in_RDI->ampm == 2) && (in_RDI->hh < 0xc)) {
    in_RDI->hh = in_RDI->hh + 0xc;
  }
  def_hour(in_RDI,in_stack_ffffffffffffffdc);
  def_minute(in_RDI,in_stack_ffffffffffffffdc);
  def_second(in_RDI,in_stack_ffffffffffffffdc);
  def_msec(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void def_time(int m, int h, int s, int ms)
    {
        /* apply the PM indicator to the time, if present and in range */
        if (ampm == 1 && hh == 12)
            hh = 0;
        else if (ampm == 2 && hh < 12)
            hh += 12;
        
        def_hour(h);
        def_minute(m);
        def_second(s);
        def_msec(ms);
    }